

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>::
removeLast(ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
           *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = *(long *)(this + 8);
  *(long *)(this + 8) = lVar1 + -0x28;
  lVar2 = *(long *)(lVar1 + -0x20);
  if (lVar2 != 0) {
    lVar3 = *(long *)(lVar1 + -0x18);
    lVar4 = *(long *)(lVar1 + -0x10);
    *(undefined8 *)(lVar1 + -0x20) = 0;
    *(undefined8 *)(lVar1 + -0x18) = 0;
    *(undefined8 *)(lVar1 + -0x10) = 0;
    (**(code **)**(undefined8 **)(lVar1 + -8))
              (*(undefined8 **)(lVar1 + -8),lVar2,8,lVar3 - lVar2 >> 3,lVar4 - lVar2 >> 3,0);
    return;
  }
  return;
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }